

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getWorldBaseTransform
          (KinDynComputations *this,MatrixView<double> *world_T_base)

{
  bool bVar1;
  Map<const_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_> local_c8;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_> local_b8;
  double local_90 [16];
  
  if ((world_T_base->m_rows == 4) && (world_T_base->m_cols == 4)) {
    iDynTree::FreeFloatingPos::worldBasePos();
    iDynTree::Transform::asHomogeneousTransform();
    local_b8.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
    .
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
    .m_cols.m_value = world_T_base->m_cols;
    local_b8.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
    .
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
    .m_data = world_T_base->m_storage;
    local_b8.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
    .
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
    .m_rows.m_value = world_T_base->m_rows;
    local_b8.m_stride.m_outer.m_value = 1;
    local_b8.m_stride.m_inner.m_value =
         local_b8.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
         .m_rows.m_value;
    if (world_T_base->m_storageOrder != ColumnMajor) {
      local_b8.m_stride.m_outer.m_value =
           local_b8.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
           .m_cols.m_value;
      local_b8.m_stride.m_inner.m_value = 1;
    }
    local_c8.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_data = local_90;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<_1,_1>>,Eigen::Map<Eigen::Matrix<double,4,4,1,4,4>const,0,Eigen::Stride<0,0>>>
              (&local_b8,&local_c8);
    bVar1 = true;
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getWorldBaseTransform","Wrong size in input world_T_base");
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool KinDynComputations::getWorldBaseTransform(iDynTree::MatrixView<double> world_T_base) const
{
    constexpr int expected_transform_cols = 4;
    constexpr int expected_transform_rows = 4;
    bool ok = (world_T_base.rows() == expected_transform_rows) && (world_T_base.cols() == expected_transform_cols);
    if( !ok )
    {
        reportError("KinDynComputations","getWorldBaseTransform","Wrong size in input world_T_base");
        return false;
    }

    toEigen(world_T_base) = toEigen(this->pimpl->m_pos.worldBasePos().asHomogeneousTransform());

    return true;
}